

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O0

uchar * x509v3_hex_to_bytes(char *str,size_t *len)

{
  int iVar1;
  size_t sVar2;
  size_t *psVar3;
  byte local_42;
  uint8_t local_41;
  uint8_t low;
  size_t *psStack_40;
  uint8_t high;
  uchar *p;
  uchar cl;
  byte *pbStack_30;
  uchar ch;
  uchar *q;
  uchar *hexbuf;
  size_t *len_local;
  char *str_local;
  
  hexbuf = (uchar *)len;
  len_local = (size_t *)str;
  if (str == (char *)0x0) {
    ERR_put_error(0x14,0,0x7c,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_utl.cc"
                  ,0x1c0);
    str_local = (char *)0x0;
  }
  else {
    sVar2 = strlen(str);
    q = (uchar *)OPENSSL_malloc(sVar2 >> 1);
    if (q == (byte *)0x0) {
      OPENSSL_free((void *)0x0);
      str_local = (char *)0x0;
    }
    else {
      psStack_40 = len_local;
      psVar3 = psStack_40;
      pbStack_30 = q;
      while (psStack_40 = psVar3, (byte)*psStack_40 != 0) {
        psVar3 = (size_t *)((long)psStack_40 + 1);
        p._7_1_ = (byte)*psStack_40;
        if (p._7_1_ != 0x3a) {
          psStack_40 = (size_t *)((long)psStack_40 + 2);
          p._6_1_ = *(byte *)psVar3;
          if (p._6_1_ == 0) {
            ERR_put_error(0x14,0,0x92,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_utl.cc"
                          ,0x1ce);
            OPENSSL_free(q);
            return (uchar *)0x0;
          }
          iVar1 = OPENSSL_fromxdigit(&local_41,(uint)p._7_1_);
          if ((iVar1 == 0) || (iVar1 = OPENSSL_fromxdigit(&local_42,(uint)p._6_1_), iVar1 == 0)) {
            OPENSSL_free(q);
            ERR_put_error(0x14,0,0x76,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_utl.cc"
                          ,0x1e7);
            return (uchar *)0x0;
          }
          *pbStack_30 = local_41 << 4 | local_42;
          psVar3 = psStack_40;
          pbStack_30 = pbStack_30 + 1;
        }
      }
      if (hexbuf != (uchar *)0x0) {
        *(long *)hexbuf = (long)pbStack_30 - (long)q;
      }
      str_local = (char *)q;
    }
  }
  return (uchar *)str_local;
}

Assistant:

unsigned char *x509v3_hex_to_bytes(const char *str, size_t *len) {
  unsigned char *hexbuf, *q;
  unsigned char ch, cl, *p;
  uint8_t high, low;
  if (!str) {
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_NULL_ARGUMENT);
    return NULL;
  }
  if (!(hexbuf =
            reinterpret_cast<uint8_t *>(OPENSSL_malloc(strlen(str) >> 1)))) {
    goto err;
  }
  for (p = (unsigned char *)str, q = hexbuf; *p;) {
    ch = *p++;
    if (ch == ':') {
      continue;
    }
    cl = *p++;
    if (!cl) {
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_ODD_NUMBER_OF_DIGITS);
      OPENSSL_free(hexbuf);
      return NULL;
    }
    if (!OPENSSL_fromxdigit(&high, ch)) {
      goto badhex;
    }
    if (!OPENSSL_fromxdigit(&low, cl)) {
      goto badhex;
    }
    *q++ = (high << 4) | low;
  }

  if (len) {
    *len = q - hexbuf;
  }

  return hexbuf;

err:
  OPENSSL_free(hexbuf);
  return NULL;

badhex:
  OPENSSL_free(hexbuf);
  OPENSSL_PUT_ERROR(X509V3, X509V3_R_ILLEGAL_HEX_DIGIT);
  return NULL;
}